

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tiles.h
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> *
sfc::mirror<unsigned_char>
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *source,uint width,bool horizontal,
          bool vertical)

{
  uchar uVar1;
  pointer puVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  runtime_error *this;
  uint uVar7;
  ulong uVar8;
  uchar *puVar9;
  int iVar10;
  pointer puVar11;
  uchar *puVar12;
  pointer puVar13;
  vector<unsigned_char,_std::allocator<unsigned_char>_> mv;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  ulong local_38;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__,source);
  uVar8 = (long)(source->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(source->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  local_38 = CONCAT44(0,width);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_38;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar8;
  if ((uVar8 % local_38 == 0) && (iVar6 = SUB164(auVar5 / auVar4,0), uVar8 == iVar6 * width)) {
    if (horizontal && iVar6 != 0) {
      uVar7 = 0;
      uVar8 = 0;
      do {
        puVar2 = (__return_storage_ptr__->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        puVar13 = puVar2 + (int)uVar8 * width;
        puVar11 = puVar13 + (local_38 - 1);
        if (puVar13 < puVar11) {
          puVar9 = puVar2 + uVar7;
          do {
            puVar12 = puVar9 + 1;
            uVar1 = *puVar9;
            *puVar9 = *puVar11;
            *puVar11 = uVar1;
            puVar11 = puVar11 + -1;
            puVar9 = puVar12;
          } while (puVar12 < puVar11);
        }
        uVar8 = uVar8 + 1;
        uVar7 = uVar7 + width;
      } while (uVar8 < (SUB168(auVar5 / auVar4,0) & 0xffffffff));
    }
    if (vertical) {
      local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (uchar *)0x0;
      local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (uchar *)0x0;
      if (-1 < iVar6 + -1) {
        iVar6 = iVar6 + -1;
        do {
          if (width != 0) {
            iVar10 = 0;
            uVar8 = local_38;
            do {
              puVar9 = (__return_storage_ptr__->
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                       super__Vector_impl_data._M_start + (iVar6 * width + iVar10);
              if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish ==
                  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_char,std::allocator<unsigned_char>>::
                _M_realloc_insert<unsigned_char_const&>
                          ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_58,
                           (iterator)
                           local_58.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish,puVar9);
              }
              else {
                *local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish = *puVar9;
                local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              iVar10 = iVar10 + 1;
              uVar8 = uVar8 - 1;
            } while (uVar8 != 0);
          }
          bVar3 = 0 < iVar6;
          iVar6 = iVar6 + -1;
        } while (bVar3);
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (__return_storage_ptr__,&local_58);
      if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_58.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Can\'t mirror non-square image vector");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline std::vector<T> mirror(const std::vector<T>& source, unsigned width, bool horizontal, bool vertical) {
  auto m = source;
  unsigned height = (unsigned)(source.size() / width);
  if ((source.size() % width != 0) || (source.size() != width * height))
    throw std::runtime_error("Can't mirror non-square image vector");

  if (horizontal) {
    for (unsigned row = 0; row < height; ++row)
      std::reverse(m.begin() + (row * width), m.begin() + (row * width) + width);
  }

  if (vertical) {
    std::vector<T> mv;
    for (int row = height - 1; row >= 0; --row) {
      for (unsigned column = 0; column < width; ++column)
        mv.push_back(m[(row * width) + column]);
    }
    m = mv;
  }

  return m;
}